

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::BatchnormLayerParams::SerializeWithCachedSizes
          (BatchnormLayerParams *this,CodedOutputStream *output)

{
  float value;
  
  if (this->channels_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,this->channels_,output);
  }
  if (this->computemeanvar_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(5,true,output);
  }
  if (this->instancenormalization_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(6,true,output);
  }
  value = this->epsilon_;
  if ((value != 0.0) || (NAN(value))) {
    google::protobuf::internal::WireFormatLite::WriteFloat(10,value,output);
  }
  if (this->gamma_ != (WeightParams *)0x0 &&
      this != (BatchnormLayerParams *)&_BatchnormLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0xf,&this->gamma_->super_MessageLite,output);
  }
  if (this->beta_ != (WeightParams *)0x0 &&
      this != (BatchnormLayerParams *)&_BatchnormLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x10,&this->beta_->super_MessageLite,output);
  }
  if (this->mean_ != (WeightParams *)0x0 &&
      this != (BatchnormLayerParams *)&_BatchnormLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x11,&this->mean_->super_MessageLite,output);
  }
  if (this->variance_ != (WeightParams *)0x0 &&
      this != (BatchnormLayerParams *)&_BatchnormLayerParams_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x12,&this->variance_->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void BatchnormLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.BatchnormLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 channels = 1;
  if (this->channels() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->channels(), output);
  }

  // bool computeMeanVar = 5;
  if (this->computemeanvar() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(5, this->computemeanvar(), output);
  }

  // bool instanceNormalization = 6;
  if (this->instancenormalization() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(6, this->instancenormalization(), output);
  }

  // float epsilon = 10;
  if (this->epsilon() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(10, this->epsilon(), output);
  }

  // .CoreML.Specification.WeightParams gamma = 15;
  if (this->has_gamma()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      15, *this->gamma_, output);
  }

  // .CoreML.Specification.WeightParams beta = 16;
  if (this->has_beta()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      16, *this->beta_, output);
  }

  // .CoreML.Specification.WeightParams mean = 17;
  if (this->has_mean()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      17, *this->mean_, output);
  }

  // .CoreML.Specification.WeightParams variance = 18;
  if (this->has_variance()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      18, *this->variance_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.BatchnormLayerParams)
}